

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  int extraout_EAX;
  ulong uVar7;
  char *__addr;
  long lVar8;
  long lVar9;
  int *piVar10;
  int *piVar11;
  int iVar12;
  int *piVar13;
  advent_t *paVar14;
  int *piVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  long lVar21;
  ulong uVar22;
  int *piVar23;
  undefined8 uVar24;
  byte bVar25;
  byte bVar26;
  ulong uVar27;
  ushort uVar28;
  undefined1 auVar30 [32];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar29 [32];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 in_ZMM8 [64];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  double local_38;
  
  lVar21 = 8;
  paVar14 = advent2018;
  local_38 = 0.0;
  while( true ) {
    uVar17 = 0x100000;
    load_input(input_t&,std::__cxx11::string_const&)::backsplash =
         (char *)mmap(load_input(input_t&,std::__cxx11::string_const&)::backsplash,0x100000,1,
                      (uint)(load_input(input_t&,std::__cxx11::string_const&)::backsplash !=
                            (char *)0x0) << 4 | 0x22,-1,0);
    if (load_input(input_t&,std::__cxx11::string_const&)::backsplash == (char *)0xffffffffffffffff)
    break;
    uVar7 = 0;
    iVar6 = open(*(char **)((long)&advent2018[0].fn + lVar21),0);
    if (iVar6 == -1) goto LAB_00102f21;
    uVar17 = 0;
    uVar7 = lseek(iVar6,0,2);
    if (0x100000 < uVar7) {
LAB_00102f12:
      main_cold_5();
LAB_00102f17:
      main_cold_4();
      break;
    }
    uVar17 = uVar7;
    __addr = (char *)mmap(load_input(input_t&,std::__cxx11::string_const&)::backsplash,uVar7,1,0x12,
                          iVar6,0);
    if (__addr == (char *)0xffffffffffffffff) goto LAB_00102f17;
    if (__addr != load_input(input_t&,std::__cxx11::string_const&)::backsplash) {
      main_cold_1();
    }
    iVar6 = close(iVar6);
    if (iVar6 == -1) {
      paVar14 = (advent_t *)((long)&advent2018[0].fn + lVar21);
      main_cold_3();
      goto LAB_00102f12;
    }
    lVar8 = std::chrono::_V2::steady_clock::now();
    (**(code **)(lVar21 + 0x11b178))(__addr,uVar7);
    lVar9 = std::chrono::_V2::steady_clock::now();
    iVar6 = munmap(__addr,uVar7);
    if (iVar6 == -1) goto LAB_00102f2c;
    local_38 = local_38 + (double)(lVar9 - lVar8);
    printf(anon_var_dwarf_2d29,(long)((double)(lVar9 - lVar8) * 0.001));
    lVar21 = lVar21 + 0x28;
    if (lVar21 == 0x3f0) {
      printf(anon_var_dwarf_2d3f,(long)(local_38 * 0.001));
      return 0;
    }
  }
  main_cold_7();
  uVar7 = uVar17;
LAB_00102f21:
  __addr = (char *)((long)&paVar14->fn + lVar21);
  main_cold_6();
LAB_00102f2c:
  main_cold_2();
  piVar10 = (int *)operator_new(12000);
  piVar15 = piVar10 + 3000;
  piVar23 = piVar10;
  if (uVar7 == 0) {
    uVar19 = piVar10[-3];
  }
  else {
    iVar6 = 0;
    uVar19 = 0;
    iVar20 = 0;
    do {
      bVar25 = *__addr - 0x30;
      if (bVar25 < 10) {
        iVar6 = (uint)bVar25 + iVar6 * 10;
      }
      else {
        uVar19 = uVar19 | *__addr == '-';
        if (iVar6 == 0) {
          iVar6 = 0;
        }
        else {
          uVar17 = (long)piVar10 - (long)piVar23;
          iVar20 = (-uVar19 ^ iVar6 - uVar19) + iVar20;
          uVar16 = ((long)uVar17 >> 2) * -0x5555555555555555;
          if (piVar10 == piVar15) {
            if (uVar17 == 0x7ffffffffffffff8) {
              std::__throw_length_error("vector::_M_realloc_insert");
            }
            uVar27 = uVar16;
            if (piVar10 == piVar23) {
              uVar27 = 1;
            }
            uVar22 = uVar27 + uVar16;
            if (0xaaaaaaaaaaaaaa9 < uVar22) {
              uVar22 = 0xaaaaaaaaaaaaaaa;
            }
            if (CARRY8(uVar27,uVar16)) {
              uVar22 = 0xaaaaaaaaaaaaaaa;
            }
            piVar11 = (int *)operator_new(uVar22 * 0xc);
            *(int *)((long)piVar11 + uVar17) = iVar20;
            *(undefined4 *)((long)piVar11 + uVar17 + 4) = 0;
            *(int *)((long)piVar11 + uVar17 + 8) = (int)uVar16;
            piVar13 = piVar11;
            for (piVar15 = piVar23; piVar10 != piVar15; piVar15 = piVar15 + 3) {
              piVar13[2] = piVar15[2];
              *(undefined8 *)piVar13 = *(undefined8 *)piVar15;
              piVar13 = piVar13 + 3;
            }
            if (piVar23 != (int *)0x0) {
              operator_delete(piVar23,uVar17);
            }
            piVar15 = piVar11 + uVar22 * 3;
          }
          else {
            *piVar10 = iVar20;
            piVar10[1] = 0;
            piVar10[2] = (int)uVar16;
            piVar11 = piVar23;
            piVar13 = piVar10;
          }
          uVar19 = 0;
          piVar10 = piVar13 + 3;
          iVar6 = 0;
          piVar23 = piVar11;
        }
      }
      uVar7 = uVar7 - 1;
      __addr = __addr + 1;
    } while (uVar7 != 0);
    uVar19 = piVar10[-3];
    if (piVar23 != piVar10) {
      lVar21 = (long)piVar10 - (long)piVar23;
      auVar31 = vpmovzxbq_avx512f(ZEXT816(0xb4a89c9084786c60));
      auVar32 = vpmovsxbq_avx512f(ZEXT816(0x54483c3024180c00));
      auVar33 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar34 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      vpmovzxbd_avx512f(_DAT_001143a8);
      auVar35 = vpbroadcastq_avx512f(ZEXT816(4));
      auVar36 = vpbroadcastd_avx512f();
      auVar37 = vpternlogd_avx512f(in_ZMM8,in_ZMM8,in_ZMM8,0xff);
      uVar17 = 0;
      auVar38 = vpbroadcastq_avx512f();
      auVar38 = vpsrlq_avx512f(auVar38,3);
      piVar13 = piVar23;
      do {
        auVar39 = vpbroadcastq_avx512f();
        auVar40 = vporq_avx512f(auVar39,auVar33);
        auVar41 = vporq_avx512f(auVar39,auVar34);
        uVar7 = vpcmpuq_avx512f(auVar41,auVar38,2);
        uVar16 = vpcmpuq_avx512f(auVar40,auVar38,2);
        bVar25 = (byte)uVar16;
        bVar26 = (byte)uVar7;
        uVar28 = CONCAT11(bVar25,bVar26);
        auVar40 = vpgatherdd_avx512f(*(undefined4 *)((long)piVar13 + uVar17));
        iVar18 = (uint)(bVar26 & 1) * auVar40._0_4_;
        iVar6 = (uint)((byte)(uVar28 >> 1) & 1) * auVar40._4_4_;
        auVar30._4_4_ = iVar6;
        auVar30._0_4_ = iVar18;
        iVar12 = (uint)((byte)(uVar28 >> 2) & 1) * auVar40._8_4_;
        auVar30._8_4_ = iVar12;
        iVar20 = (uint)((byte)(uVar28 >> 3) & 1) * auVar40._12_4_;
        auVar30._12_4_ = iVar20;
        auVar30._16_4_ = (uint)((byte)(uVar28 >> 4) & 1) * auVar40._16_4_;
        auVar30._20_4_ = (uint)((byte)(uVar28 >> 5) & 1) * auVar40._20_4_;
        auVar30._24_4_ = (uint)((byte)(uVar28 >> 6) & 1) * auVar40._24_4_;
        auVar30._28_4_ = (uint)((byte)(uVar28 >> 7) & 1) * auVar40._28_4_;
        auVar39._32_4_ = (uint)(bVar25 & 1) * auVar40._32_4_;
        auVar39._0_32_ = auVar30;
        auVar39._36_4_ = (uint)(bVar25 >> 1 & 1) * auVar40._36_4_;
        auVar39._40_4_ = (uint)(bVar25 >> 2 & 1) * auVar40._40_4_;
        auVar39._44_4_ = (uint)(bVar25 >> 3 & 1) * auVar40._44_4_;
        auVar39._48_4_ = (uint)(bVar25 >> 4 & 1) * auVar40._48_4_;
        auVar39._52_4_ = (uint)(bVar25 >> 5 & 1) * auVar40._52_4_;
        auVar39._56_4_ = (uint)(bVar25 >> 6 & 1) * auVar40._56_4_;
        auVar39._60_4_ = (uint)(bVar25 >> 7) * auVar40._60_4_;
        if ((uVar7 & 1) != 0) {
          auVar41 = ZEXT464((uint)(iVar18 / (int)uVar19));
        }
        if ((uVar7 & 2) != 0) {
          auVar4 = vpinsrd_avx(auVar41._0_16_,iVar6 / (int)uVar19,1);
          auVar41 = vinserti32x4_avx512f(auVar41,auVar4,0);
        }
        if ((uVar7 & 4) != 0) {
          auVar4 = vpinsrd_avx(auVar41._0_16_,iVar12 / (int)uVar19,2);
          auVar41 = vinserti32x4_avx512f(auVar41,auVar4,0);
        }
        if ((uVar7 & 8) != 0) {
          auVar4 = vpinsrd_avx(auVar41._0_16_,iVar20 / (int)uVar19,3);
          auVar41 = vinserti32x4_avx512f(auVar41,auVar4,0);
        }
        auVar40 = auVar41;
        if ((uVar7 & 0x10) != 0) {
          auVar42 = vpbroadcastd_avx512f();
          auVar40._0_16_ = auVar41._0_16_;
          auVar40._16_4_ = auVar42._16_4_;
          auVar40._20_4_ = auVar41._20_4_;
          auVar40._24_4_ = auVar41._24_4_;
          auVar40._28_4_ = auVar41._28_4_;
          auVar40._32_4_ = auVar41._32_4_;
          auVar40._36_4_ = auVar41._36_4_;
          auVar40._40_4_ = auVar41._40_4_;
          auVar40._44_4_ = auVar41._44_4_;
          auVar40._48_4_ = auVar41._48_4_;
          auVar40._52_4_ = auVar41._52_4_;
          auVar40._56_4_ = auVar41._56_4_;
          auVar40._60_4_ = auVar41._60_4_;
        }
        auVar41 = auVar40;
        if ((uVar7 & 0x20) != 0) {
          auVar42 = vpbroadcastd_avx512f();
          auVar41._0_20_ = auVar40._0_20_;
          auVar41._20_4_ = auVar42._20_4_;
          auVar41._24_4_ = auVar40._24_4_;
          auVar41._28_4_ = auVar40._28_4_;
          auVar41._32_4_ = auVar40._32_4_;
          auVar41._36_4_ = auVar40._36_4_;
          auVar41._40_4_ = auVar40._40_4_;
          auVar41._44_4_ = auVar40._44_4_;
          auVar41._48_4_ = auVar40._48_4_;
          auVar41._52_4_ = auVar40._52_4_;
          auVar41._56_4_ = auVar40._56_4_;
          auVar41._60_4_ = auVar40._60_4_;
        }
        auVar42 = auVar41;
        if ((uVar7 & 0x40) != 0) {
          auVar40 = vpbroadcastd_avx512f();
          auVar42._0_24_ = auVar41._0_24_;
          auVar42._24_4_ = auVar40._24_4_;
          auVar42._28_4_ = auVar41._28_4_;
          auVar42._32_4_ = auVar41._32_4_;
          auVar42._36_4_ = auVar41._36_4_;
          auVar42._40_4_ = auVar41._40_4_;
          auVar42._44_4_ = auVar41._44_4_;
          auVar42._48_4_ = auVar41._48_4_;
          auVar42._52_4_ = auVar41._52_4_;
          auVar42._56_4_ = auVar41._56_4_;
          auVar42._60_4_ = auVar41._60_4_;
        }
        auVar43 = auVar42;
        if ((uVar7 & 0x80) != 0) {
          auVar40 = vpbroadcastd_avx512f();
          auVar43._0_28_ = auVar42._0_28_;
          auVar43._28_4_ = auVar40._28_4_;
          auVar43._32_4_ = auVar42._32_4_;
          auVar43._36_4_ = auVar42._36_4_;
          auVar43._40_4_ = auVar42._40_4_;
          auVar43._44_4_ = auVar42._44_4_;
          auVar43._48_4_ = auVar42._48_4_;
          auVar43._52_4_ = auVar42._52_4_;
          auVar43._56_4_ = auVar42._56_4_;
          auVar43._60_4_ = auVar42._60_4_;
        }
        vextracti32x4_avx512f(auVar39,2);
        auVar44 = auVar43;
        if ((uVar16 & 1) != 0) {
          auVar40 = vpbroadcastd_avx512f();
          auVar44._0_32_ = auVar43._0_32_;
          auVar44._32_4_ = auVar40._32_4_;
          auVar44._36_4_ = auVar43._36_4_;
          auVar44._40_4_ = auVar43._40_4_;
          auVar44._44_4_ = auVar43._44_4_;
          auVar44._48_4_ = auVar43._48_4_;
          auVar44._52_4_ = auVar43._52_4_;
          auVar44._56_4_ = auVar43._56_4_;
          auVar44._60_4_ = auVar43._60_4_;
        }
        auVar45 = auVar44;
        if ((uVar16 & 2) != 0) {
          auVar40 = vpbroadcastd_avx512f();
          auVar45._0_36_ = auVar44._0_36_;
          auVar45._36_4_ = auVar40._36_4_;
          auVar45._40_4_ = auVar44._40_4_;
          auVar45._44_4_ = auVar44._44_4_;
          auVar45._48_4_ = auVar44._48_4_;
          auVar45._52_4_ = auVar44._52_4_;
          auVar45._56_4_ = auVar44._56_4_;
          auVar45._60_4_ = auVar44._60_4_;
        }
        auVar46 = auVar45;
        if ((uVar16 & 4) != 0) {
          auVar40 = vpbroadcastd_avx512f();
          auVar46._0_40_ = auVar45._0_40_;
          auVar46._40_4_ = auVar40._40_4_;
          auVar46._44_4_ = auVar45._44_4_;
          auVar46._48_4_ = auVar45._48_4_;
          auVar46._52_4_ = auVar45._52_4_;
          auVar46._56_4_ = auVar45._56_4_;
          auVar46._60_4_ = auVar45._60_4_;
        }
        auVar47 = auVar46;
        if ((uVar16 & 8) != 0) {
          auVar40 = vpbroadcastd_avx512f();
          auVar47._0_44_ = auVar46._0_44_;
          auVar47._44_4_ = auVar40._44_4_;
          auVar47._48_4_ = auVar46._48_4_;
          auVar47._52_4_ = auVar46._52_4_;
          auVar47._56_4_ = auVar46._56_4_;
          auVar47._60_4_ = auVar46._60_4_;
        }
        vextracti32x4_avx512f(auVar39,3);
        auVar48 = auVar47;
        if ((uVar16 & 0x10) != 0) {
          auVar39 = vpbroadcastd_avx512f();
          auVar48._0_48_ = auVar47._0_48_;
          auVar48._48_4_ = auVar39._48_4_;
          auVar48._52_4_ = auVar47._52_4_;
          auVar48._56_4_ = auVar47._56_4_;
          auVar48._60_4_ = auVar47._60_4_;
        }
        auVar49 = auVar48;
        if ((uVar16 & 0x20) != 0) {
          auVar39 = vpbroadcastd_avx512f();
          auVar49._0_52_ = auVar48._0_52_;
          auVar49._52_4_ = auVar39._52_4_;
          auVar49._56_4_ = auVar48._56_4_;
          auVar49._60_4_ = auVar48._60_4_;
        }
        auVar50 = auVar49;
        if ((uVar16 & 0x40) != 0) {
          auVar39 = vpbroadcastd_avx512f();
          auVar50._0_56_ = auVar49._0_56_;
          auVar50._56_4_ = auVar39._56_4_;
          auVar50._60_4_ = auVar49._60_4_;
        }
        auVar51 = auVar50;
        if ((uVar16 & 0x80) != 0) {
          auVar39 = vpbroadcastd_avx512f();
          auVar51._60_4_ = auVar39._60_4_;
          auVar51._0_60_ = auVar50._0_60_;
        }
        auVar39 = vpbroadcastq_avx512f();
        auVar29 = vextracti64x4_avx512f(auVar51,1);
        auVar41 = ZEXT3264(auVar29);
        auVar40 = vpaddq_avx512f(auVar39,auVar31);
        auVar39 = vpaddq_avx512f(auVar39,auVar32);
        auVar65 = auVar39._0_32_;
        vpscatterqd_avx512f(ZEXT832(4) + auVar65,uVar7,auVar51._0_32_);
        auVar64 = auVar40._0_32_;
        vpscatterqd_avx512f(ZEXT832(4) + auVar64,uVar16,auVar29);
        if ((uVar7 & 1) != 0) {
          auVar41 = ZEXT464((uint)(iVar18 % (int)uVar19));
        }
        if ((uVar7 & 2) != 0) {
          auVar4 = vpinsrd_avx512dq(auVar41._0_16_,iVar6 % (int)uVar19,1);
          auVar41 = vinserti32x4_avx512f(auVar41,auVar4,0);
        }
        if ((uVar7 & 4) != 0) {
          auVar4 = vpinsrd_avx512dq(auVar41._0_16_,iVar12 % (int)uVar19,2);
          auVar41 = vinserti32x4_avx512f(auVar41,auVar4,0);
        }
        if ((uVar7 & 8) != 0) {
          auVar4 = vpinsrd_avx512dq(auVar41._0_16_,iVar20 % (int)uVar19,3);
          auVar41 = vinserti32x4_avx512f(auVar41,auVar4,0);
        }
        auVar52 = auVar41;
        if ((uVar7 & 0x10) != 0) {
          vextracti32x4_avx512vl(auVar30,1);
          auVar42 = vpbroadcastd_avx512f();
          auVar52._0_16_ = auVar41._0_16_;
          auVar52._16_4_ = auVar42._16_4_;
          auVar52._20_4_ = auVar41._20_4_;
          auVar52._24_4_ = auVar41._24_4_;
          auVar52._28_4_ = auVar41._28_4_;
          auVar52._32_4_ = auVar41._32_4_;
          auVar52._36_4_ = auVar41._36_4_;
          auVar52._40_4_ = auVar41._40_4_;
          auVar52._44_4_ = auVar41._44_4_;
          auVar52._48_4_ = auVar41._48_4_;
          auVar52._52_4_ = auVar41._52_4_;
          auVar52._56_4_ = auVar41._56_4_;
          auVar52._60_4_ = auVar41._60_4_;
        }
        auVar53 = auVar52;
        if ((uVar7 & 0x20) != 0) {
          vextracti32x4_avx512vl(auVar30,1);
          auVar41 = vpbroadcastd_avx512f();
          auVar53._0_20_ = auVar52._0_20_;
          auVar53._20_4_ = auVar41._20_4_;
          auVar53._24_4_ = auVar52._24_4_;
          auVar53._28_4_ = auVar52._28_4_;
          auVar53._32_4_ = auVar52._32_4_;
          auVar53._36_4_ = auVar52._36_4_;
          auVar53._40_4_ = auVar52._40_4_;
          auVar53._44_4_ = auVar52._44_4_;
          auVar53._48_4_ = auVar52._48_4_;
          auVar53._52_4_ = auVar52._52_4_;
          auVar53._56_4_ = auVar52._56_4_;
          auVar53._60_4_ = auVar52._60_4_;
        }
        auVar54 = auVar53;
        if ((uVar7 & 0x40) != 0) {
          vextracti32x4_avx512vl(auVar30,1);
          auVar41 = vpbroadcastd_avx512f();
          auVar54._0_24_ = auVar53._0_24_;
          auVar54._24_4_ = auVar41._24_4_;
          auVar54._28_4_ = auVar53._28_4_;
          auVar54._32_4_ = auVar53._32_4_;
          auVar54._36_4_ = auVar53._36_4_;
          auVar54._40_4_ = auVar53._40_4_;
          auVar54._44_4_ = auVar53._44_4_;
          auVar54._48_4_ = auVar53._48_4_;
          auVar54._52_4_ = auVar53._52_4_;
          auVar54._56_4_ = auVar53._56_4_;
          auVar54._60_4_ = auVar53._60_4_;
        }
        auVar55 = auVar54;
        if ((uVar7 & 0x80) != 0) {
          auVar41 = vpbroadcastd_avx512f();
          auVar55._0_28_ = auVar54._0_28_;
          auVar55._28_4_ = auVar41._28_4_;
          auVar55._32_4_ = auVar54._32_4_;
          auVar55._36_4_ = auVar54._36_4_;
          auVar55._40_4_ = auVar54._40_4_;
          auVar55._44_4_ = auVar54._44_4_;
          auVar55._48_4_ = auVar54._48_4_;
          auVar55._52_4_ = auVar54._52_4_;
          auVar55._56_4_ = auVar54._56_4_;
          auVar55._60_4_ = auVar54._60_4_;
        }
        auVar56 = auVar55;
        if ((uVar16 & 1) != 0) {
          auVar41 = vpbroadcastd_avx512f();
          auVar56._0_32_ = auVar55._0_32_;
          auVar56._32_4_ = auVar41._32_4_;
          auVar56._36_4_ = auVar55._36_4_;
          auVar56._40_4_ = auVar55._40_4_;
          auVar56._44_4_ = auVar55._44_4_;
          auVar56._48_4_ = auVar55._48_4_;
          auVar56._52_4_ = auVar55._52_4_;
          auVar56._56_4_ = auVar55._56_4_;
          auVar56._60_4_ = auVar55._60_4_;
        }
        auVar57 = auVar56;
        if ((uVar16 & 2) != 0) {
          auVar41 = vpbroadcastd_avx512f();
          auVar57._0_36_ = auVar56._0_36_;
          auVar57._36_4_ = auVar41._36_4_;
          auVar57._40_4_ = auVar56._40_4_;
          auVar57._44_4_ = auVar56._44_4_;
          auVar57._48_4_ = auVar56._48_4_;
          auVar57._52_4_ = auVar56._52_4_;
          auVar57._56_4_ = auVar56._56_4_;
          auVar57._60_4_ = auVar56._60_4_;
        }
        auVar58 = auVar57;
        if ((uVar16 & 4) != 0) {
          auVar41 = vpbroadcastd_avx512f();
          auVar58._0_40_ = auVar57._0_40_;
          auVar58._40_4_ = auVar41._40_4_;
          auVar58._44_4_ = auVar57._44_4_;
          auVar58._48_4_ = auVar57._48_4_;
          auVar58._52_4_ = auVar57._52_4_;
          auVar58._56_4_ = auVar57._56_4_;
          auVar58._60_4_ = auVar57._60_4_;
        }
        auVar59 = auVar58;
        if ((uVar16 & 8) != 0) {
          auVar41 = vpbroadcastd_avx512f();
          auVar59._0_44_ = auVar58._0_44_;
          auVar59._44_4_ = auVar41._44_4_;
          auVar59._48_4_ = auVar58._48_4_;
          auVar59._52_4_ = auVar58._52_4_;
          auVar59._56_4_ = auVar58._56_4_;
          auVar59._60_4_ = auVar58._60_4_;
        }
        auVar60 = auVar59;
        if ((uVar16 & 0x10) != 0) {
          auVar41 = vpbroadcastd_avx512f();
          auVar60._0_48_ = auVar59._0_48_;
          auVar60._48_4_ = auVar41._48_4_;
          auVar60._52_4_ = auVar59._52_4_;
          auVar60._56_4_ = auVar59._56_4_;
          auVar60._60_4_ = auVar59._60_4_;
        }
        auVar61 = auVar60;
        if ((uVar16 & 0x20) != 0) {
          auVar41 = vpbroadcastd_avx512f();
          auVar61._0_52_ = auVar60._0_52_;
          auVar61._52_4_ = auVar41._52_4_;
          auVar61._56_4_ = auVar60._56_4_;
          auVar61._60_4_ = auVar60._60_4_;
        }
        auVar62 = auVar61;
        if ((uVar16 & 0x40) != 0) {
          auVar41 = vpbroadcastd_avx512f();
          auVar62._0_56_ = auVar61._0_56_;
          auVar62._56_4_ = auVar41._56_4_;
          auVar62._60_4_ = auVar61._60_4_;
        }
        auVar63 = auVar62;
        if ((uVar16 & 0x80) != 0) {
          auVar41 = vpbroadcastd_avx512f();
          auVar63._60_4_ = auVar41._60_4_;
          auVar63._0_60_ = auVar62._0_60_;
        }
        uVar24 = vpmovd2m_avx512dq(auVar63);
        auVar30 = vextracti64x4_avx512f(auVar63,1);
        auVar39 = vpaddq_avx512f(auVar39,auVar35);
        auVar41 = vpaddd_avx512f(auVar51,auVar37);
        auVar40 = vpaddq_avx512f(auVar40,auVar35);
        uVar17 = uVar17 + 0x10;
        piVar13 = piVar13 + 0x30;
        vpscatterqd_avx512f(ZEXT832(0) + auVar65,uVar7,auVar63._0_32_);
        uVar27 = (ulong)(bVar26 & (byte)uVar24);
        vpscatterqd_avx512f(ZEXT832(0) + auVar64,uVar16,auVar30);
        auVar42 = vpaddd_avx512f(auVar63,auVar36);
        uVar7 = (ulong)(bVar25 & (byte)((ulong)uVar24 >> 8));
        vpscatterqd_avx512f(ZEXT832(0) + auVar65,uVar27,auVar42._0_32_);
        auVar30 = vextracti64x4_avx512f(auVar42,1);
        vpscatterqd_avx512f(ZEXT832(0) + auVar64,uVar7,auVar30);
        vpscatterqd_avx512f(ZEXT832(0) + auVar39._0_32_,uVar27,auVar41._0_32_);
        auVar30 = vextracti64x4_avx512f(auVar41,1);
        vpscatterqd_avx512f(ZEXT832(0) + auVar40._0_32_,uVar7,auVar30);
      } while (((lVar21 - 0xcU) / 0xc + 0x10 & 0xfffffffffffffff0) != uVar17);
      if (piVar23 != piVar10) {
        iVar6 = (int)LZCOUNT((lVar21 >> 2) * -0x5555555555555555);
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<(anonymous_namespace)::val_t*,std::vector<(anonymous_namespace)::val_t,std::allocator<(anonymous_namespace)::val_t>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (piVar23,piVar10,iVar6 * 2 ^ 0x7e);
        if (lVar21 < 0xc1) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<(anonymous_namespace)::val_t*,std::vector<(anonymous_namespace)::val_t,std::allocator<(anonymous_namespace)::val_t>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (piVar23,piVar10);
        }
        else {
          piVar13 = piVar23 + 0x30;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<(anonymous_namespace)::val_t*,std::vector<(anonymous_namespace)::val_t,std::allocator<(anonymous_namespace)::val_t>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (piVar23,piVar13);
          if (piVar13 != piVar10) {
            do {
              std::
              __unguarded_linear_insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::val_t*,std::vector<(anonymous_namespace)::val_t,std::allocator<(anonymous_namespace)::val_t>>>,__gnu_cxx::__ops::_Val_less_iter>
                        (piVar13);
              piVar13 = piVar13 + 3;
            } while (piVar13 != piVar10);
            if (piVar23 == piVar10) goto LAB_001037b3;
          }
        }
        piVar13 = piVar23;
        iVar20 = -1;
        iVar12 = 0;
        iVar18 = 0;
        do {
          iVar1 = piVar13[1];
          iVar2 = *piVar13;
          iVar3 = piVar13[2];
          iVar18 = iVar1 - iVar18;
          iVar5 = iVar1 * uVar19 + iVar20;
          if (iVar2 != iVar20) {
            iVar12 = 0x7fffffff;
            iVar18 = 0x7fffffff;
            iVar5 = 0x7fffffff;
          }
          *piVar13 = iVar18;
          piVar13[1] = iVar12;
          piVar13[2] = iVar5;
          piVar13 = piVar13 + 3;
          iVar20 = iVar2;
          iVar12 = iVar3;
          iVar18 = iVar1;
        } while (piVar13 != piVar10);
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<(anonymous_namespace)::val_t*,std::vector<(anonymous_namespace)::val_t,std::allocator<(anonymous_namespace)::val_t>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (piVar23,piVar10,iVar6 * 2 ^ 0x7e);
        if (lVar21 < 0xc1) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<(anonymous_namespace)::val_t*,std::vector<(anonymous_namespace)::val_t,std::allocator<(anonymous_namespace)::val_t>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (piVar23,piVar10);
        }
        else {
          piVar13 = piVar23 + 0x30;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<(anonymous_namespace)::val_t*,std::vector<(anonymous_namespace)::val_t,std::allocator<(anonymous_namespace)::val_t>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (piVar23,piVar13);
          for (; piVar13 != piVar10; piVar13 = piVar13 + 3) {
            std::
            __unguarded_linear_insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::val_t*,std::vector<(anonymous_namespace)::val_t,std::allocator<(anonymous_namespace)::val_t>>>,__gnu_cxx::__ops::_Val_less_iter>
                      (piVar13);
          }
        }
      }
    }
  }
LAB_001037b3:
  printf("Day 01 Part 1: %d\nDay 01 Part 2: %d\n",(ulong)uVar19,(ulong)(uint)piVar23[2]);
  operator_delete(piVar23,(long)piVar15 - (long)piVar23);
  return extraout_EAX;
}

Assistant:

int main() {
	double total_time = 0;

	for (auto &A : advent2018) {
		input_t input;

		load_input(input, A.input_file);
		auto t0 = std::chrono::steady_clock::now();
		(*A.fn)(input);
		auto elapsed = std::chrono::steady_clock::now() - t0;
		free_input(input);

		total_time += elapsed.count();
		printf("[%ld μs]\n", int64_t(elapsed.count() * 1e-3));
	}
	printf("Total: %ld μs\n", int64_t(total_time * 1e-3));

	return 0;
}